

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Statement> __thiscall Parser::whileStatement(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar1;
  shared_ptr<Expression> local_58 [2];
  undefined1 local_38 [8];
  ptr<StatementBlock> statBlock;
  ptr<Expression> condition;
  Parser *this_local;
  
  consume(in_RSI);
  expression((Parser *)
             &statBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  in_RSI->functionCounter = in_RSI->functionCounter + 1;
  statementBlock((Parser *)local_38);
  in_RSI->functionCounter = in_RSI->functionCounter + -1;
  make<WhileStatement,std::shared_ptr<Expression>&,std::shared_ptr<StatementBlock>&>
            (local_58,(shared_ptr<StatementBlock> *)
                      &statBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::shared_ptr<Statement>::shared_ptr<WhileStatement,void>
            ((shared_ptr<Statement> *)this,(shared_ptr<WhileStatement> *)local_58);
  std::shared_ptr<WhileStatement>::~shared_ptr((shared_ptr<WhileStatement> *)local_58);
  std::shared_ptr<StatementBlock>::~shared_ptr((shared_ptr<StatementBlock> *)local_38);
  std::shared_ptr<Expression>::~shared_ptr
            ((shared_ptr<Expression> *)
             &statBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar1.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::whileStatement() {
    consume();
    ptr<Expression> condition = expression();

    functionCounter++;
    ptr<StatementBlock> statBlock = statementBlock();
    functionCounter--;

    return make<WhileStatement>(condition, statBlock);
}